

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall TPZVec<Fad<float>_>::~TPZVec(TPZVec<Fad<float>_> *this)

{
  Fad<float> *pFVar1;
  long lVar2;
  long lVar3;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_01655c20;
  pFVar1 = this->fStore;
  if (pFVar1 != (Fad<float> *)0x0) {
    lVar2 = *(long *)&pFVar1[-1].defaultVal;
    if (lVar2 != 0) {
      lVar3 = lVar2 << 5;
      do {
        Vector<float>::destroy((Vector<float> *)((long)pFVar1 + lVar3 + -0x18));
        lVar3 = lVar3 + -0x20;
      } while (lVar3 != 0);
    }
    operator_delete__(&pFVar1[-1].defaultVal,lVar2 << 5 | 8);
    return;
  }
  return;
}

Assistant:

inline TPZVec<T>::~TPZVec() {
	if( fStore )
	{
		delete [] fStore;
	}
}